

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_loc.c
# Opt level: O3

int dwarf_get_locdesc_entry_e
              (Dwarf_Loc_Head_c loclist_head,Dwarf_Unsigned index,Dwarf_Small *lle_value_out,
              Dwarf_Unsigned *rawval1,Dwarf_Unsigned *rawval2,Dwarf_Bool *debug_addr_unavailable,
              Dwarf_Addr *lowpc_out,Dwarf_Addr *hipc_out,Dwarf_Unsigned *loclist_expr_op_count_out,
              Dwarf_Unsigned *lle_bytecount,Dwarf_Locdesc_c_conflict *locdesc_entry_out,
              Dwarf_Small *loclist_source_out,Dwarf_Unsigned *expression_offset_out,
              Dwarf_Unsigned *locdesc_offset_out,Dwarf_Error *error)

{
  Dwarf_Locdesc_c pDVar1;
  
  if ((loclist_head == (Dwarf_Loc_Head_c)0x0) || (loclist_head->ll_magic != 0xadab4)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: Dwarf_Loc_Head_c NULL or not marked LOCLISTS_MAGIC in calling dwarf_get_locdesc_entry_d()"
                       );
  }
  else {
    if (index < loclist_head->ll_locdesc_count) {
      pDVar1 = loclist_head->ll_locdesc;
      *lle_value_out = pDVar1[index].ld_lle_value;
      *rawval1 = pDVar1[index].ld_rawlow;
      *rawval2 = pDVar1[index].ld_rawhigh;
      *lowpc_out = pDVar1[index].ld_lopc;
      *hipc_out = pDVar1[index].ld_highpc;
      *debug_addr_unavailable = pDVar1[index].ld_index_failed;
      *loclist_expr_op_count_out = (ulong)pDVar1[index].ld_cents;
      *locdesc_entry_out = pDVar1 + index;
      *loclist_source_out = (Dwarf_Small)pDVar1[index].ld_lkind;
      *expression_offset_out = pDVar1[index].ld_section_offset;
      *locdesc_offset_out = pDVar1[index].ld_locdesc_offset;
      if (lle_bytecount == (Dwarf_Unsigned *)0x0) {
        return 0;
      }
      *lle_bytecount = pDVar1[index].ld_lle_bytecount;
      return 0;
    }
    _dwarf_error(loclist_head->ll_dbg,error,0x138);
  }
  return 1;
}

Assistant:

int
dwarf_get_locdesc_entry_e(Dwarf_Loc_Head_c loclist_head,
    /*  The context-local offset of an lle set as reverenced
        by an offset_entry_table. */
    Dwarf_Unsigned   index,
    /*Dwarf_Unsigned   base_local_index, */
    Dwarf_Small    * lle_value_out,
    Dwarf_Unsigned * rawval1,
    Dwarf_Unsigned * rawval2,
    Dwarf_Bool     * debug_addr_unavailable,
    Dwarf_Addr     * lowpc_out, /* 'cooked' value */
    Dwarf_Addr     * hipc_out, /* 'cooked' value */
    Dwarf_Unsigned * loclist_expr_op_count_out,
    /* Returns pointer to the specific locdesc of the index; */
    Dwarf_Unsigned * lle_bytecount,
    Dwarf_Locdesc_c* locdesc_entry_out,
    Dwarf_Small    * loclist_source_out, /* 0,1, or 2 */
    Dwarf_Unsigned * expression_offset_out,
    Dwarf_Unsigned * locdesc_offset_out,
    Dwarf_Error    * error)
{
    Dwarf_Locdesc_c descs_base =  0;
    Dwarf_Locdesc_c desc =  0;
    Dwarf_Unsigned  desc_count = 0;
    Dwarf_Debug     dbg = 0;

    if (!loclist_head || loclist_head->ll_magic != LOCLISTS_MAGIC) {
        _dwarf_error_string(dbg, error,DW_DLE_DBG_NULL,
            "DW_DLE_DBG_NULL: "
            "Dwarf_Loc_Head_c NULL or not "
            "marked LOCLISTS_MAGIC "
            "in calling "
            "dwarf_get_locdesc_entry_d()");
        return DW_DLV_ERROR;
    }
    desc_count = loclist_head->ll_locdesc_count;
    descs_base  = loclist_head->ll_locdesc;
    dbg = loclist_head->ll_dbg;
    if (index >= desc_count) {
        _dwarf_error(dbg, error, DW_DLE_LOCLIST_INDEX_ERROR);
        return DW_DLV_ERROR;
    }
    desc = descs_base + index;
    *lle_value_out = desc->ld_lle_value;
    *rawval1 = desc->ld_rawlow;
    *rawval2 = desc->ld_rawhigh;
    *lowpc_out = desc->ld_lopc;
    *hipc_out = desc->ld_highpc;
    *debug_addr_unavailable = desc->ld_index_failed;
    *loclist_expr_op_count_out = desc->ld_cents;
    *locdesc_entry_out = desc;
    *loclist_source_out = (Dwarf_Small)desc->ld_lkind;
    *expression_offset_out = desc->ld_section_offset;
    *locdesc_offset_out = desc->ld_locdesc_offset;
    if (lle_bytecount) {
        *lle_bytecount = desc->ld_lle_bytecount;
    }
    return DW_DLV_OK;
}